

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char> __thiscall
fmt::v11::detail::digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>
          (digit_grouping<char> *this,basic_appender<char> out,basic_string_view<char> digits)

{
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  char cVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 *__ptr;
  uint uVar9;
  int iVar10;
  undefined4 *local_828;
  ulong local_820;
  ulong local_818;
  code *local_810;
  undefined4 local_808 [502];
  
  uVar3 = digits.size_;
  __ptr = local_808;
  local_810 = basic_memory_buffer<int,_500UL,_fmt::v11::detail::allocator<int>_>::grow;
  local_818 = 500;
  local_820 = 1;
  local_808[0] = 0;
  sVar1 = (this->thousands_sep_)._M_string_length;
  uVar9 = (uint)digits.size_;
  local_828 = __ptr;
  if (sVar1 != 0) {
    pcVar6 = (this->grouping_)._M_dataplus._M_p;
    iVar10 = 0;
    do {
      pcVar5 = (this->grouping_)._M_dataplus._M_p + (this->grouping_)._M_string_length;
      if (pcVar6 == pcVar5) {
        cVar4 = pcVar5[-1];
      }
      else {
        cVar4 = *pcVar6;
        if ((byte)(cVar4 + 0x81U) < 0x82) goto LAB_001dd878;
        pcVar6 = pcVar6 + 1;
      }
      iVar10 = iVar10 + cVar4;
      if ((iVar10 == 0) || ((int)uVar9 <= iVar10)) goto LAB_001dd878;
      uVar7 = local_820 + 1;
      if (local_818 < uVar7) {
        (*local_810)(&local_828,uVar7);
        uVar7 = local_820 + 1;
        sVar1 = (this->thousands_sep_)._M_string_length;
        __ptr = local_828;
      }
      __ptr[local_820] = iVar10;
      local_820 = uVar7;
      if (sVar1 == 0) goto LAB_001dd878;
    } while( true );
  }
  iVar10 = 0;
LAB_001dd880:
  if (0 < (int)uVar9) {
    uVar7 = 0;
    do {
      if ((int)uVar3 == local_828[iVar10]) {
        pcVar6 = (this->thousands_sep_)._M_dataplus._M_p;
        buffer<char>::append<char>
                  (out.container,pcVar6,pcVar6 + (this->thousands_sep_)._M_string_length);
        iVar10 = iVar10 + -1;
      }
      cVar4 = digits.data_[uVar7];
      sVar2 = (out.container)->size_;
      uVar8 = sVar2 + 1;
      if ((out.container)->capacity_ < uVar8) {
        (*(out.container)->grow_)(out.container,uVar8);
        sVar2 = (out.container)->size_;
        uVar8 = sVar2 + 1;
      }
      (out.container)->size_ = uVar8;
      (out.container)->ptr_[sVar2] = cVar4;
      uVar7 = uVar7 + 1;
      uVar3 = (ulong)((int)uVar3 - 1);
      __ptr = local_828;
    } while ((uVar9 & 0x7fffffff) != uVar7);
  }
  if (__ptr != local_808) {
    free(__ptr);
  }
  return (basic_appender<char>)out.container;
LAB_001dd878:
  iVar10 = (int)local_820 + -1;
  goto LAB_001dd880;
}

Assistant:

auto apply(Out out, basic_string_view<C> digits) const -> Out {
    auto num_digits = static_cast<int>(digits.size());
    auto separators = basic_memory_buffer<int>();
    separators.push_back(0);
    auto state = initial_state();
    while (int i = next(state)) {
      if (i >= num_digits) break;
      separators.push_back(i);
    }
    for (int i = 0, sep_index = static_cast<int>(separators.size() - 1);
         i < num_digits; ++i) {
      if (num_digits - i == separators[sep_index]) {
        out = copy<Char>(thousands_sep_.data(),
                         thousands_sep_.data() + thousands_sep_.size(), out);
        --sep_index;
      }
      *out++ = static_cast<Char>(digits[to_unsigned(i)]);
    }
    return out;
  }